

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IcePoint.cpp
# Opt level: O1

Point * __thiscall IceMaths::Point::PositiveUnitRandomVector(Point *this)

{
  udword uVar1;
  float fVar2;
  
  uVar1 = Rand();
  this->x = (float)uVar1 * 4.656613e-10;
  uVar1 = Rand();
  this->y = (float)uVar1 * 4.656613e-10;
  uVar1 = Rand();
  fVar2 = (float)uVar1 * 4.656613e-10;
  this->z = fVar2;
  fVar2 = fVar2 * fVar2 + this->x * this->x + this->y * this->y;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    fVar2 = 1.0 / fVar2;
    this->x = this->x * fVar2;
    this->y = this->y * fVar2;
    this->z = fVar2 * this->z;
  }
  return this;
}

Assistant:

Point& Point::PositiveUnitRandomVector()
{
	x = UnitRandomFloat();
	y = UnitRandomFloat();
	z = UnitRandomFloat();
	Normalize();
	return *this;
}